

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O0

void WavParserHelper::PrintRIFFChunk(RIFFChunk rhs)

{
  undefined4 in_stack_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string WAVE;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string RIFF;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_28,&stack0x00000008,&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::__cxx11::string::resize((ulong)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,(char *)&rhs.ckSize,&local_61);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::resize((ulong)local_60);
  std::operator+(&local_88,"ChunkID: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  PrintLog(&local_88,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::to_string(&local_c8,CONCAT164(rhs,in_stack_0000000c));
  std::operator+(&local_a8,"ChunkSize: ",&local_c8);
  PrintLog(&local_a8,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::operator+(&local_e8,"WAVE: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  PrintLog(&local_e8,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_e8);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void WavParserHelper::PrintRIFFChunk(RIFFChunk rhs)
{
	//if not restrict size, there problem on \0 with char convert to string
	std::string RIFF(rhs.ckID);
	RIFF.resize(4);
	std::string WAVE(rhs.WavID);
	WAVE.resize(4);

	PrintLog("ChunkID: " + RIFF);
	PrintLog("ChunkSize: " + std::to_string(rhs.ckSize));
	PrintLog("WAVE: " + WAVE);

	std::cout << std::endl;
}